

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void pugi::impl::anon_unknown_0::node_copy_tree(xml_node_struct *dn,xml_node_struct *sn)

{
  xml_allocator *alloc;
  xml_node_struct *pxVar1;
  xml_allocator *shared_alloc;
  xml_node_struct *sn_00;
  xml_node_struct *node;
  bool bVar2;
  
  if ((dn == (xml_node_struct *)0x0) || (sn == (xml_node_struct *)0x0)) {
    __assert_fail("object",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0x489,
                  "xml_allocator &pugi::impl::(anonymous namespace)::get_allocator(const Object *) [Object = pugi::xml_node_struct]"
                 );
  }
  alloc = *(xml_allocator **)((long)dn - (dn->header >> 8));
  shared_alloc = (xml_allocator *)0x0;
  if (alloc == *(xml_allocator **)((long)sn - (sn->header >> 8))) {
    shared_alloc = alloc;
  }
  node_copy_contents(dn,sn,shared_alloc);
  sn_00 = sn->first_child;
  bVar2 = sn_00 != (xml_node_struct *)0x0;
  node = dn;
  if (sn_00 != sn && bVar2) {
    do {
      if (node == (xml_node_struct *)0x0) {
        __assert_fail("dit",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                      ,0x1168,
                      "void pugi::impl::(anonymous namespace)::node_copy_tree(xml_node_struct *, xml_node_struct *)"
                     );
      }
      if (sn_00 == dn) {
LAB_0023dedd:
        do {
          pxVar1 = sn_00->next_sibling;
          if (sn_00->next_sibling != (xml_node_struct *)0x0) break;
          sn_00 = sn_00->parent;
          node = node->parent;
          if ((sn_00 != sn) && (node == (xml_node_struct *)0x0)) {
            __assert_fail("sit == sn || dit",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                          ,0x1189,
                          "void pugi::impl::(anonymous namespace)::node_copy_tree(xml_node_struct *, xml_node_struct *)"
                         );
          }
          pxVar1 = sn_00;
        } while (sn_00 != sn);
      }
      else {
        pxVar1 = append_new_node(node,alloc,
                                 (xml_node_type)sn_00->header & (node_doctype|node_declaration));
        if (pxVar1 == (xml_node_struct *)0x0) {
LAB_0023ded7:
          bVar2 = true;
        }
        else {
          node_copy_contents(pxVar1,sn_00,shared_alloc);
          if (sn_00->first_child == (xml_node_struct *)0x0) goto LAB_0023ded7;
          bVar2 = false;
          sn_00 = sn_00->first_child;
          node = pxVar1;
        }
        pxVar1 = sn_00;
        if (bVar2) goto LAB_0023dedd;
      }
      bVar2 = pxVar1 != (xml_node_struct *)0x0;
    } while ((bVar2) && (sn_00 = pxVar1, pxVar1 != sn));
  }
  if ((bVar2) && (node != dn->parent)) {
    __assert_fail("!sit || dit == dn->parent",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0x118e,
                  "void pugi::impl::(anonymous namespace)::node_copy_tree(xml_node_struct *, xml_node_struct *)"
                 );
  }
  return;
}

Assistant:

inline xml_allocator& get_allocator(const Object* object)
	{
		assert(object);

		return *PUGI__GETPAGE(object)->allocator;
	}